

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O2

int ndn_asn1_decode_ecdsa_signature
              (uint8_t *encoded_ecdsa_sig,uint32_t encoded_ecdsa_sig_len,uint8_t *decoded_ecdsa_sig,
              uint32_t decoded_ecdsa_sig_buf_len,uint32_t *raw_ecdsa_sig_len)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *end;
  
  iVar1 = -0x85;
  if (0x3f < decoded_ecdsa_sig_buf_len) {
    *raw_ecdsa_sig_len = 0x40;
    decoded_ecdsa_sig[0x30] = '\0';
    decoded_ecdsa_sig[0x31] = '\0';
    decoded_ecdsa_sig[0x32] = '\0';
    decoded_ecdsa_sig[0x33] = '\0';
    decoded_ecdsa_sig[0x34] = '\0';
    decoded_ecdsa_sig[0x35] = '\0';
    decoded_ecdsa_sig[0x36] = '\0';
    decoded_ecdsa_sig[0x37] = '\0';
    decoded_ecdsa_sig[0x38] = '\0';
    decoded_ecdsa_sig[0x39] = '\0';
    decoded_ecdsa_sig[0x3a] = '\0';
    decoded_ecdsa_sig[0x3b] = '\0';
    decoded_ecdsa_sig[0x3c] = '\0';
    decoded_ecdsa_sig[0x3d] = '\0';
    decoded_ecdsa_sig[0x3e] = '\0';
    decoded_ecdsa_sig[0x3f] = '\0';
    decoded_ecdsa_sig[0x20] = '\0';
    decoded_ecdsa_sig[0x21] = '\0';
    decoded_ecdsa_sig[0x22] = '\0';
    decoded_ecdsa_sig[0x23] = '\0';
    decoded_ecdsa_sig[0x24] = '\0';
    decoded_ecdsa_sig[0x25] = '\0';
    decoded_ecdsa_sig[0x26] = '\0';
    decoded_ecdsa_sig[0x27] = '\0';
    decoded_ecdsa_sig[0x28] = '\0';
    decoded_ecdsa_sig[0x29] = '\0';
    decoded_ecdsa_sig[0x2a] = '\0';
    decoded_ecdsa_sig[0x2b] = '\0';
    decoded_ecdsa_sig[0x2c] = '\0';
    decoded_ecdsa_sig[0x2d] = '\0';
    decoded_ecdsa_sig[0x2e] = '\0';
    decoded_ecdsa_sig[0x2f] = '\0';
    decoded_ecdsa_sig[0x10] = '\0';
    decoded_ecdsa_sig[0x11] = '\0';
    decoded_ecdsa_sig[0x12] = '\0';
    decoded_ecdsa_sig[0x13] = '\0';
    decoded_ecdsa_sig[0x14] = '\0';
    decoded_ecdsa_sig[0x15] = '\0';
    decoded_ecdsa_sig[0x16] = '\0';
    decoded_ecdsa_sig[0x17] = '\0';
    decoded_ecdsa_sig[0x18] = '\0';
    decoded_ecdsa_sig[0x19] = '\0';
    decoded_ecdsa_sig[0x1a] = '\0';
    decoded_ecdsa_sig[0x1b] = '\0';
    decoded_ecdsa_sig[0x1c] = '\0';
    decoded_ecdsa_sig[0x1d] = '\0';
    decoded_ecdsa_sig[0x1e] = '\0';
    decoded_ecdsa_sig[0x1f] = '\0';
    decoded_ecdsa_sig[0] = '\0';
    decoded_ecdsa_sig[1] = '\0';
    decoded_ecdsa_sig[2] = '\0';
    decoded_ecdsa_sig[3] = '\0';
    decoded_ecdsa_sig[4] = '\0';
    decoded_ecdsa_sig[5] = '\0';
    decoded_ecdsa_sig[6] = '\0';
    decoded_ecdsa_sig[7] = '\0';
    decoded_ecdsa_sig[8] = '\0';
    decoded_ecdsa_sig[9] = '\0';
    decoded_ecdsa_sig[10] = '\0';
    decoded_ecdsa_sig[0xb] = '\0';
    decoded_ecdsa_sig[0xc] = '\0';
    decoded_ecdsa_sig[0xd] = '\0';
    decoded_ecdsa_sig[0xe] = '\0';
    decoded_ecdsa_sig[0xf] = '\0';
    iVar1 = -0x88;
    if ((((encoded_ecdsa_sig_len != 0) && (encoded_ecdsa_sig_len != 1)) &&
        (*encoded_ecdsa_sig == '0')) &&
       (end = encoded_ecdsa_sig + encoded_ecdsa_sig_len,
       encoded_ecdsa_sig + (ulong)encoded_ecdsa_sig[1] + 2 == end)) {
      puVar2 = readAsn1Int(encoded_ecdsa_sig + 2,end,decoded_ecdsa_sig);
      puVar2 = readAsn1Int(puVar2,end,decoded_ecdsa_sig + 0x20);
      iVar1 = -0x88;
      if (puVar2 == end) {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
ndn_asn1_decode_ecdsa_signature(const uint8_t *encoded_ecdsa_sig, uint32_t encoded_ecdsa_sig_len,
                                uint8_t *decoded_ecdsa_sig, uint32_t decoded_ecdsa_sig_buf_len,
                                uint32_t *raw_ecdsa_sig_len)
{
  if (decoded_ecdsa_sig_buf_len < NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE) {
    return NDN_ASN1_ECDSA_SIG_BUFFER_TOO_SMALL;
  }
  *raw_ecdsa_sig_len = NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE;

  bool ok = decodeSignatureBits(encoded_ecdsa_sig, encoded_ecdsa_sig_len, decoded_ecdsa_sig);
  return ok ? NDN_SUCCESS : NDN_ASN1_ECDSA_SIG_FAILED_TO_READ_ASN1_INT;
}